

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_b<ncnn::BinaryOp_x86_avx_functor::binary_op_mul>
               (float *ptr,float *ptr1,float *outptr,int size,int elempack)

{
  float fVar1;
  int in_ECX;
  float *in_RDX;
  float *in_RSI;
  float *in_RDI;
  int in_R8D;
  __m128 _outp_1;
  __m128 _p_1;
  __m256 _outp;
  __m256 _p;
  __m256 _b_256;
  __m128 _b_128;
  int i;
  float b;
  binary_op_mul op;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  float fStack_288;
  undefined8 local_270;
  undefined8 uStack_268;
  int local_1bc;
  float *local_1a8;
  float *local_198;
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_80;
  float fStack_7c;
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  undefined4 uStack_64;
  float local_50;
  float fStack_4c;
  float fStack_48;
  float fStack_44;
  float local_40;
  float fStack_3c;
  float fStack_38;
  float fStack_34;
  
  fVar1 = *in_RSI;
  local_1bc = 0;
  if (in_R8D == 4) {
    local_270 = *(undefined8 *)in_RSI;
    uStack_268 = *(undefined8 *)(in_RSI + 2);
  }
  else {
    local_270 = CONCAT44(fVar1,fVar1);
    uStack_268 = CONCAT44(fVar1,fVar1);
  }
  fStack_48 = (float)uStack_268;
  local_1a8 = in_RDX;
  local_198 = in_RDI;
  if (in_R8D == 8) {
    local_2a0 = *(undefined8 *)in_RSI;
    uStack_298 = *(undefined8 *)(in_RSI + 2);
    uStack_290 = *(undefined8 *)(in_RSI + 4);
    fStack_288 = (float)*(undefined8 *)(in_RSI + 6);
  }
  else {
    local_2a0 = local_270;
    uStack_298 = uStack_268;
    uStack_290 = local_270;
    fStack_288 = fStack_48;
  }
  for (; local_1bc + 7 < in_ECX; local_1bc = local_1bc + 8) {
    local_80 = (float)*(undefined8 *)local_198;
    fStack_7c = (float)((ulong)*(undefined8 *)local_198 >> 0x20);
    fStack_78 = (float)*(undefined8 *)(local_198 + 2);
    fStack_74 = (float)((ulong)*(undefined8 *)(local_198 + 2) >> 0x20);
    fStack_70 = (float)*(undefined8 *)(local_198 + 4);
    fStack_6c = (float)((ulong)*(undefined8 *)(local_198 + 4) >> 0x20);
    fStack_68 = (float)*(undefined8 *)(local_198 + 6);
    uStack_64 = (undefined4)((ulong)*(undefined8 *)(local_198 + 6) >> 0x20);
    local_a0 = (float)local_2a0;
    fStack_9c = (float)((ulong)local_2a0 >> 0x20);
    fStack_98 = (float)uStack_298;
    fStack_94 = (float)((ulong)uStack_298 >> 0x20);
    fStack_90 = (float)uStack_290;
    fStack_8c = (float)((ulong)uStack_290 >> 0x20);
    *(ulong *)local_1a8 = CONCAT44(fStack_7c * fStack_9c,local_80 * local_a0);
    *(ulong *)(local_1a8 + 2) = CONCAT44(fStack_74 * fStack_94,fStack_78 * fStack_98);
    *(ulong *)(local_1a8 + 4) = CONCAT44(fStack_6c * fStack_8c,fStack_70 * fStack_90);
    *(ulong *)(local_1a8 + 6) = CONCAT44(uStack_64,fStack_68 * fStack_288);
    local_198 = local_198 + 8;
    local_1a8 = local_1a8 + 8;
  }
  for (; local_1bc + 3 < in_ECX; local_1bc = local_1bc + 4) {
    local_40 = (float)*(undefined8 *)local_198;
    fStack_3c = (float)((ulong)*(undefined8 *)local_198 >> 0x20);
    fStack_38 = (float)*(undefined8 *)(local_198 + 2);
    fStack_34 = (float)((ulong)*(undefined8 *)(local_198 + 2) >> 0x20);
    local_50 = (float)local_270;
    fStack_4c = (float)((ulong)local_270 >> 0x20);
    fStack_44 = (float)((ulong)uStack_268 >> 0x20);
    *(ulong *)local_1a8 = CONCAT44(fStack_3c * fStack_4c,local_40 * local_50);
    *(ulong *)(local_1a8 + 2) = CONCAT44(fStack_34 * fStack_44,fStack_38 * fStack_48);
    local_198 = local_198 + 4;
    local_1a8 = local_1a8 + 4;
  }
  for (; local_1bc < in_ECX; local_1bc = local_1bc + 1) {
    *local_1a8 = *local_198 * fVar1;
    local_198 = local_198 + 1;
    local_1a8 = local_1a8 + 1;
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_b(const float* ptr, const float* ptr1, float* outptr, int size, int elempack)
{
    const Op op;

    const float b = *ptr1;

    int i = 0;
#if __SSE2__
    __m128 _b_128 = (elempack == 4) ? _mm_loadu_ps(ptr1) : _mm_set1_ps(b);
#if __AVX__
    __m256 _b_256 = (elempack == 8) ? _mm256_loadu_ps(ptr1) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b_128), _b_128, 1);
#if __AVX512F__
    __m512 _b_512 = (elempack == 16) ? _mm512_loadu_ps(ptr1) : _mm512_insertf32x8(_mm512_castps256_ps512(_b_256), _b_256, 1);
    for (; i + 15 < size; i += 16)
    {
        __m512 _p = _mm512_loadu_ps(ptr);
        __m512 _outp = op.func_pack16(_p, _b_512);
        _mm512_storeu_ps(outptr, _outp);
        ptr += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    for (; i + 7 < size; i += 8)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        __m256 _outp = op.func_pack8(_p, _b_256);
        _mm256_storeu_ps(outptr, _outp);
        ptr += 8;
        outptr += 8;
    }
#endif // __AVX__
    for (; i + 3 < size; i += 4)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        __m128 _outp = op.func_pack4(_p, _b_128);
        _mm_storeu_ps(outptr, _outp);
        ptr += 4;
        outptr += 4;
    }
#endif // __SSE2__
    for (; i < size; i++)
    {
        *outptr = op.func(*ptr, b);
        ptr += 1;
        outptr += 1;
    }
}